

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_mount.c
# Opt level: O1

LY_ERR schema_mount_create_ctx
                 (lysc_ext_instance *ext,lyd_node *ext_data,ly_bool config,ly_ctx **ext_ctx)

{
  char **ppcVar1;
  char *search_dir;
  ly_ctx **pplVar2;
  uint16_t uVar3;
  LY_ERR err;
  char **ppcVar4;
  lys_module *plVar5;
  lysc_node *plVar6;
  lysc_node *plVar7;
  undefined7 in_register_00000011;
  lysc_node *plVar8;
  ulong uVar9;
  uint32_t idx;
  char *sdirs;
  uint32_t local_54;
  char *local_50;
  undefined4 local_44;
  lyd_node *local_40;
  ly_ctx **local_38;
  
  local_44 = (undefined4)CONCAT71(in_register_00000011,config);
  local_50 = (char *)0x0;
  local_54 = 0;
  local_40 = ext_data;
  local_38 = ext_ctx;
  ppcVar4 = ly_ctx_get_searchdirs(ext->module->ctx);
  if ((ppcVar4 != (char **)0x0) && (*ppcVar4 != (char *)0x0)) {
    uVar9 = 1;
    do {
      err = ly_strcat(&local_50,"%s:");
      if (err != LY_SUCCESS) goto LAB_001a2c1e;
      ppcVar1 = ppcVar4 + uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (*ppcVar1 != (char *)0x0);
  }
  search_dir = local_50;
  uVar3 = ly_ctx_get_options(ext->module->ctx);
  pplVar2 = local_38;
  err = ly_ctx_new_yldata(search_dir,local_40,(uint)uVar3,local_38);
  if (err == LY_SUCCESS) {
    err = LY_SUCCESS;
    if (((char)local_44 == '\0') &&
       (plVar5 = ly_ctx_get_module_iter(*pplVar2,&local_54), plVar5 != (lys_module *)0x0)) {
      do {
        if (plVar5->implemented != '\0') {
          for (plVar8 = plVar5->compiled->data; plVar7 = plVar8, plVar8 != (lysc_node *)0x0;
              plVar8 = plVar8->next) {
            do {
              plVar7->flags = plVar7->flags & 0xfffc | 2;
              plVar6 = lysc_node_child(plVar7);
              if (plVar6 == (lysc_node *)0x0) {
                if (plVar7 == plVar8) break;
                plVar6 = plVar7->next;
              }
              if (plVar6 == (lysc_node *)0x0) {
                for (plVar7 = plVar7->parent;
                    (plVar7 != plVar8 && (plVar6 = plVar7->next, plVar6 == (lysc_node *)0x0));
                    plVar7 = plVar7->parent) {
                }
              }
              plVar7 = plVar6;
            } while (plVar6 != (lysc_node *)0x0);
          }
        }
        plVar5 = ly_ctx_get_module_iter(*pplVar2,&local_54);
      } while (plVar5 != (lys_module *)0x0);
    }
  }
  else {
    lyplg_ext_compile_log
              ((lysc_ctx *)0x0,ext,LY_LLERR,err,
               "Failed to create context for the schema-mount data.");
  }
LAB_001a2c1e:
  free(local_50);
  return err;
}

Assistant:

static LY_ERR
schema_mount_create_ctx(const struct lysc_ext_instance *ext, const struct lyd_node *ext_data, ly_bool config,
        struct ly_ctx **ext_ctx)
{
    LY_ERR rc = LY_SUCCESS;
    const char * const *searchdirs;
    char *sdirs = NULL;
    const struct lys_module *mod;
    struct lysc_node *root, *node;
    uint32_t i, idx = 0;

    /* get searchdirs from the current context */
    searchdirs = ly_ctx_get_searchdirs(ext->module->ctx);

    if (searchdirs) {
        /* append them all into a single string */
        for (i = 0; searchdirs[i]; ++i) {
            if ((rc = ly_strcat(&sdirs, "%s" PATH_SEPARATOR, searchdirs[i]))) {
                goto cleanup;
            }
        }
    }

    /* create the context based on the data */
    if ((rc = ly_ctx_new_yldata(sdirs, ext_data, ly_ctx_get_options(ext->module->ctx), ext_ctx))) {
        lyplg_ext_compile_log(NULL, ext, LY_LLERR, rc, "Failed to create context for the schema-mount data.");
        goto cleanup;
    }

    if (!config) {
        /* manually change the config of all schema nodes in all the modules */
        while ((mod = ly_ctx_get_module_iter(*ext_ctx, &idx))) {
            if (!mod->implemented) {
                continue;
            }

            LY_LIST_FOR(mod->compiled->data, root) {
                LYSC_TREE_DFS_BEGIN(root, node) {
                    node->flags &= ~LYS_CONFIG_W;
                    node->flags |= LYS_CONFIG_R;

                    LYSC_TREE_DFS_END(root, node);
                }
            }
        }
    }

cleanup:
    free(sdirs);
    return rc;
}